

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  char *pcVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  char cVar5;
  pointer pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  size_type sVar11;
  undefined8 *puVar12;
  int iVar13;
  undefined7 in_register_00000009;
  size_type *psVar14;
  ulong uVar15;
  string *psVar16;
  char *pcVar17;
  pointer pbVar18;
  long lVar19;
  string *e;
  bool bVar20;
  string content;
  string result;
  string local_d8;
  pointer *local_b8;
  pointer local_b0;
  pointer local_a8 [2];
  string local_98;
  undefined1 local_78 [40];
  long local_50;
  undefined4 local_48;
  PreprocessContext local_44;
  string *local_40;
  string *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000009,resolveRelative);
  local_40 = __return_storage_ptr__;
  if (context == StripAllGeneratorExpressions) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    lVar19 = std::__cxx11::string::find((char *)input,0x489ff4,0);
    if (lVar19 != -1) {
      paVar3 = &local_d8.field_2;
LAB_001582dd:
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pcVar10 = (input->_M_dataplus)._M_p + lVar19 + 2;
      iVar13 = 1;
      pcVar17 = pcVar10;
      do {
        cVar4 = *pcVar17;
        if (cVar4 == '$') {
          pcVar1 = pcVar17 + 1;
          if (*pcVar1 == '<') {
            pcVar17 = pcVar17 + 1;
          }
          iVar13 = iVar13 + (uint)(*pcVar1 == '<');
        }
        else if (cVar4 == '>') {
          iVar13 = iVar13 + -1;
          if (iVar13 == 0) {
            lVar19 = std::__cxx11::string::find
                               ((char *)input,0x489ff4,
                                (ulong)(pcVar17 + (lVar19 - (long)pcVar10) + 3));
            if (lVar19 != -1) goto LAB_001582dd;
            break;
          }
        }
        else if (cVar4 == '\0') goto LAB_00158368;
        pcVar17 = pcVar17 + 1;
      } while( true );
    }
LAB_0015848b:
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
LAB_001584d1:
    psVar16 = local_40;
    StripEmptyListElements(local_40,&local_98);
    goto LAB_001584e6;
  }
  local_44 = context;
  if (InstallInterface < context) {
    __assert_fail("false && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorExpression.cxx"
                  ,0x15a,
                  "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                 );
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  uVar8 = std::__cxx11::string::find((char *)input,0x48a11a,0);
  uVar9 = std::__cxx11::string::find((char *)input,0x48a12d,0);
  psVar16 = input;
  if ((uVar9 & uVar8) != 0xffffffffffffffff) {
LAB_00157db5:
    local_38 = psVar16;
    uVar15 = uVar9;
    if (uVar8 < uVar9) {
      uVar15 = uVar8;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar15 = uVar8;
    }
    if (uVar8 == 0xffffffffffffffff) {
      uVar15 = uVar9;
    }
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (input->_M_dataplus)._M_p;
    cVar4 = pcVar6[uVar15 + 2];
    local_50 = uVar15 + (ulong)(cVar4 == 'I') * 2 + 0x12;
    pcVar10 = pcVar6 + local_50;
    iVar13 = 1;
    pcVar17 = pcVar10;
LAB_00157e45:
    cVar5 = *pcVar17;
    if (cVar5 == '$') {
      pcVar1 = pcVar17 + 1;
      if (*pcVar1 == '<') {
        pcVar17 = pcVar17 + 1;
      }
      iVar13 = iVar13 + (uint)(*pcVar1 == '<');
LAB_00157e72:
      pcVar17 = pcVar17 + 1;
      goto LAB_00157e45;
    }
    if (cVar5 != '>') {
      if (cVar5 == '\0') goto LAB_00157e77;
      goto LAB_00157e72;
    }
    iVar13 = iVar13 + -1;
    if (iVar13 != 0) goto LAB_00157e72;
    if ((local_44 == BuildInterface) && (cVar4 != 'I')) {
      lVar19 = (long)pcVar17 - (long)pcVar10;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_00157ed0;
    }
    if ((local_44 == InstallInterface) && (cVar4 == 'I')) {
      lVar19 = (long)pcVar17 - (long)pcVar10;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
      if ((char)local_48 == '\0') {
        std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
      }
      else {
        local_b8 = local_a8;
        local_78._0_8_ = (pointer)0x12;
        local_b8 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)local_78);
        local_a8[0] = (pointer)local_78._0_8_;
        *local_b8 = (pointer)0x524f504d495f7b24;
        local_b8[1] = (pointer)0x5849464552505f54;
        *(undefined2 *)(local_b8 + 2) = 0x2f7d;
        local_b0 = (pointer)local_78._0_8_;
        *(char *)((long)local_b8 + local_78._0_8_) = '\0';
        local_78._0_8_ = (string *)0x0;
        local_78._8_8_ = (string *)0x0;
        local_78._16_8_ = (pointer)0x0;
        Split(&local_d8,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
        uVar7 = local_78._8_8_;
        for (psVar16 = (string *)local_78._0_8_; psVar16 != (string *)uVar7; psVar16 = psVar16 + 1)
        {
          std::__cxx11::string::append((char *)&local_98);
          bVar20 = cmsys::SystemTools::FileIsFullPath(psVar16);
          if ((!bVar20) && (sVar11 = Find(psVar16), sVar11 != 0)) {
            std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
          }
          std::__cxx11::string::_M_append((char *)&local_98,(ulong)(psVar16->_M_dataplus)._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_78);
        input = local_38;
        if (local_b8 != local_a8) {
          operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
        }
      }
LAB_00157ed0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      lVar19 = (long)pcVar17 - (long)pcVar10;
    }
    pcVar10 = (char *)(lVar19 + 1);
    bVar20 = true;
    if (*pcVar17 == '\0') goto LAB_00158065;
    goto LAB_001581ca;
  }
LAB_0015823a:
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  goto LAB_00158280;
LAB_00158368:
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)input);
  puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x489ff4);
  psVar14 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_d8.field_2._M_allocated_capacity = *psVar14;
    local_d8.field_2._8_8_ = puVar12[3];
    local_d8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar14;
    local_d8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_d8._M_string_length = puVar12[1];
  *puVar12 = psVar14;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
  }
  lVar19 = std::__cxx11::string::find
                     ((char *)input,0x489ff4,(ulong)(pcVar17 + lVar19 + 2 + (1 - (long)pcVar10)));
  if (lVar19 == -1) {
    if (iVar13 != 0) goto LAB_001584d1;
    goto LAB_0015848b;
  }
  goto LAB_001582dd;
LAB_00157e77:
  pcVar10 = pcVar17 + (1 - (long)pcVar10);
  bVar20 = iVar13 == 0;
LAB_00158065:
  pcVar17 = "$<BUILD_INTERFACE:";
  if (cVar4 == 'I') {
    pcVar17 = "$<INSTALL_INTERFACE:";
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,pcVar17,pcVar17 + (ulong)(cVar4 == 'I') * 2 + 0x12);
  std::__cxx11::string::substr((ulong)local_78,(ulong)input);
  pbVar18 = (pointer)0xf;
  if (local_b8 != local_a8) {
    pbVar18 = local_a8[0];
  }
  pbVar2 = (pointer)((long)&((_Alloc_hider *)local_78._8_8_)->_M_p +
                    (long)&(local_b0->_M_dataplus)._M_p);
  if (pbVar18 < pbVar2) {
    pbVar18 = (pointer)0xf;
    if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
      pbVar18 = (pointer)local_78._16_8_;
    }
    if (pbVar2 <= pbVar18) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0015811d;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,local_78._0_8_);
LAB_0015811d:
  psVar14 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_d8.field_2._M_allocated_capacity = *psVar14;
    local_d8.field_2._8_8_ = puVar12[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar14;
    local_d8._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_d8._M_string_length = puVar12[1];
  *puVar12 = psVar14;
  puVar12[1] = 0;
  *(undefined1 *)psVar14 = 0;
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_78._16_8_)->_M_p + 1));
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
  }
LAB_001581ca:
  pcVar10 = pcVar10 + local_50;
  uVar8 = std::__cxx11::string::find((char *)input,0x48a11a,(ulong)pcVar10);
  uVar9 = std::__cxx11::string::find((char *)input,0x48a12d,(ulong)pcVar10);
  psVar16 = local_38;
  if ((uVar9 & uVar8) == 0xffffffffffffffff) goto LAB_00158233;
  goto LAB_00157db5;
LAB_00158233:
  if (bVar20) goto LAB_0015823a;
LAB_00158280:
  psVar16 = local_40;
  StripEmptyListElements(local_40,&local_98);
LAB_001584e6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return psVar16;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string& input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions) {
    return stripAllGeneratorExpressions(input);
  }
  if (context == BuildInterface || context == InstallInterface) {
    return stripExportInterface(input, context, resolveRelative);
  }

  assert(false &&
         "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}